

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTableWidgetItem_*>::appendInitialize
          (QArrayDataPointer<QTableWidgetItem_*> *this,qsizetype newSize)

{
  QTableWidgetItem **ppQVar1;
  QTableWidgetItem *in_RSI;
  QTableWidgetItem **in_RDI;
  QTableWidgetItem **e;
  QTableWidgetItem **b;
  
  begin((QArrayDataPointer<QTableWidgetItem_*> *)0x8e3510);
  ppQVar1 = begin((QArrayDataPointer<QTableWidgetItem_*> *)0x8e3529);
  std::uninitialized_value_construct<QTableWidgetItem**>(ppQVar1 + (long)in_RSI,in_RDI);
  in_RDI[2] = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }